

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::OutputMeanDamageRatio
          (aggreports *this,int eptype,int eptype_tvar,offset_in_OutLosses_to_subr GetOutLoss,
          vector<int,_std::allocator<int>_> *fileIDs)

{
  int eptype_00;
  int eptype_tvar_00;
  size_type sVar1;
  vector<int,_std::allocator<int>_> *in_R9;
  int epcalc;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  int eptype_tvar_local;
  int eptype_local;
  aggreports *this_local;
  
  eptype_00 = (uint)(this->ordFlag_ & 1) + (uint)((this->ordFlag_ ^ 0xffU) & 1);
  eptype_tvar_00 = (uint)(this->ordFlag_ & 1) * eptype;
  sVar1 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
          size(&this->periodstoweighting_);
  if (sVar1 == 0) {
    MeanDamageRatio(this,in_R9,GetOutLoss,(int)fileIDs,eptype_00,eptype_tvar_00);
  }
  else {
    MeanDamageRatioWithWeighting(this,in_R9,GetOutLoss,(int)fileIDs,eptype_00,eptype_tvar_00);
  }
  return;
}

Assistant:

void aggreports::OutputMeanDamageRatio(int eptype, const int eptype_tvar,
				       OASIS_FLOAT (OutLosses::*GetOutLoss)(),
				       const std::vector<int> &fileIDs) {

  // EPCalc = MEANDR for ORD output
  // EPCalc = 1 for legacy output
  int epcalc = ordFlag_ * MEANDR + !ordFlag_;
  // EPType doubles as ensemble ID for legacy output
  eptype *= ordFlag_;   // Set to default value 0 in legacy output

  if (periodstoweighting_.size() == 0) {
    MeanDamageRatio(fileIDs, GetOutLoss, epcalc, eptype, eptype_tvar);
    return;
  }

  MeanDamageRatioWithWeighting(fileIDs, GetOutLoss, epcalc, eptype,
			       eptype_tvar);

}